

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O2

void __thiscall script_p2sh_tests::norecurse::test_method(norecurse *this)

{
  long lVar1;
  shared_count sVar2;
  bool bVar3;
  CScript *pCVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar7;
  char *local_228;
  char *local_220;
  assertion_result local_218;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  ScriptError err;
  string local_148;
  assertion_result local_128;
  string *local_110;
  CScript p2sh2;
  CScript scriptSig;
  CScript scriptSig2;
  CScript p2sh;
  CScript invalidAsScript;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  invalidAsScript.super_CScriptBase._union._16_8_ = 0;
  invalidAsScript.super_CScriptBase._24_8_ = 0;
  invalidAsScript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  invalidAsScript.super_CScriptBase._union._8_8_ = 0;
  pCVar4 = CScript::operator<<(&invalidAsScript,OP_INVALIDOPCODE);
  CScript::operator<<(pCVar4,OP_INVALIDOPCODE);
  ScriptHash::ScriptHash((ScriptHash *)&scriptSig,&invalidAsScript);
  scriptSig2.super_CScriptBase._union._16_4_ = scriptSig.super_CScriptBase._union._16_4_;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect =
       scriptSig.super_CScriptBase._union.indirect_contents.indirect;
  scriptSig2.super_CScriptBase._union._8_8_ = scriptSig.super_CScriptBase._union._8_8_;
  GetScriptForDestination(&p2sh,(CTxDestination *)&scriptSig2);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&scriptSig2);
  scriptSig.super_CScriptBase._union._16_8_ = 0;
  scriptSig.super_CScriptBase._24_8_ = 0;
  scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptSig.super_CScriptBase._union._8_8_ = 0;
  Serialize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig2,&invalidAsScript);
  CScript::operator<<(&scriptSig,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig2);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x93;
  file.m_begin = (iterator)&local_160;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_170,msg);
  bVar3 = Verify(&scriptSig,&p2sh,true,&err);
  p2sh2.super_CScriptBase._union.direct[0] = !bVar3;
  p2sh2.super_CScriptBase._union._8_8_ = 0;
  p2sh2.super_CScriptBase._union._16_8_ = 0;
  scriptSig2.super_CScriptBase._24_8_ = &local_128;
  local_128._0_8_ = "!Verify(scriptSig, p2sh, true, err)";
  local_128.m_message.px = (element_type *)0xbd77cc;
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011481f0;
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_178 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&p2sh2,(lazy_ostream *)&scriptSig2,1,0,WARN,_cVar7,
             (size_t)&local_180,0x93);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&p2sh2.super_CScriptBase._union + 0x10));
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x94;
  file_00.m_begin = (iterator)&local_190;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a0,
             msg_00);
  local_128.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(err == SCRIPT_ERR_BAD_OPCODE);
  local_128.m_message.px = (element_type *)0x0;
  local_128.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)&p2sh2,err);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_01147fb0;
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1a8 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = &DAT_00000001;
  scriptSig2.super_CScriptBase._24_8_ = (string *)&p2sh2;
  boost::test_tools::tt_detail::report_assertion
            (&local_128,(lazy_ostream *)&scriptSig2,1,1,WARN,_cVar7,(size_t)&local_1b0,0x94);
  std::__cxx11::string::~string((string *)&p2sh2);
  boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
  ScriptHash::ScriptHash((ScriptHash *)&local_128,&p2sh);
  sVar2.pi_ = local_128.m_message.pn.pi_;
  scriptSig2.super_CScriptBase._union._16_1_ = (uchar)local_128.m_message.pn.pi_;
  scriptSig2.super_CScriptBase._union._17_1_ = local_128.m_message.pn.pi_._1_1_;
  scriptSig2.super_CScriptBase._union._18_1_ = local_128.m_message.pn.pi_._2_1_;
  scriptSig2.super_CScriptBase._union._19_1_ = local_128.m_message.pn.pi_._3_1_;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = (char *)local_128._0_8_;
  scriptSig2.super_CScriptBase._union._8_8_ = local_128.m_message.px;
  local_128.m_message.pn.pi_ = sVar2.pi_;
  GetScriptForDestination(&p2sh2,(CTxDestination *)&scriptSig2);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&scriptSig2);
  scriptSig2.super_CScriptBase._union._16_8_ = 0;
  scriptSig2.super_CScriptBase._24_8_ = 0;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptSig2.super_CScriptBase._union._8_8_ = 0;
  Serialize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,&invalidAsScript);
  pCVar4 = CScript::operator<<(&scriptSig2,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  Serialize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148,&p2sh);
  CScript::operator<<(pCVar4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x9c;
  file_01.m_begin = (iterator)&local_1c0;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1d0,
             msg_01);
  local_148._M_dataplus._M_p._0_1_ = Verify(&scriptSig2,&p2sh2,true,&err);
  local_148._M_string_length = 0;
  local_148.field_2._M_allocated_capacity = 0;
  local_110 = (string *)&local_218;
  local_218._0_8_ = "Verify(scriptSig2, p2sh2, true, err)";
  local_218.m_message.px = (element_type *)0xbd77f1;
  local_128.m_message.px = (element_type *)((ulong)local_128.m_message.px & 0xffffffffffffff00);
  local_128._0_8_ = &PTR__lazy_ostream_011481f0;
  local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1d8 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_148,(lazy_ostream *)&local_128,1,0,WARN,_cVar7,
             (size_t)&local_1e0,0x9c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_148.field_2._M_allocated_capacity);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x9d;
  file_02.m_begin = (iterator)&local_1f0;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_200,
             msg_02);
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(err == SCRIPT_ERR_OK);
  local_218.m_message.px = (element_type *)0x0;
  local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_(&local_148,err);
  local_128.m_message.px = (element_type *)((ulong)local_128.m_message.px & 0xffffffffffffff00);
  local_128._0_8_ = &PTR__lazy_ostream_01147fb0;
  local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_220 = "";
  local_110 = &local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,(lazy_ostream *)&local_128,1,1,WARN,_cVar7,(size_t)&local_228,0x9d);
  std::__cxx11::string::~string((string *)&local_148);
  boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig2.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&p2sh2.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&p2sh.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&invalidAsScript.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(norecurse)
{
    ScriptError err;
    // Make sure only the outer pay-to-script-hash does the
    // extra-validation thing:
    CScript invalidAsScript;
    invalidAsScript << OP_INVALIDOPCODE << OP_INVALIDOPCODE;

    CScript p2sh = GetScriptForDestination(ScriptHash(invalidAsScript));

    CScript scriptSig;
    scriptSig << Serialize(invalidAsScript);

    // Should not verify, because it will try to execute OP_INVALIDOPCODE
    BOOST_CHECK(!Verify(scriptSig, p2sh, true, err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_BAD_OPCODE, ScriptErrorString(err));

    // Try to recur, and verification should succeed because
    // the inner HASH160 <> EQUAL should only check the hash:
    CScript p2sh2 = GetScriptForDestination(ScriptHash(p2sh));
    CScript scriptSig2;
    scriptSig2 << Serialize(invalidAsScript) << Serialize(p2sh);

    BOOST_CHECK(Verify(scriptSig2, p2sh2, true, err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
}